

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::QualifiedIdentifier::~QualifiedIdentifier(QualifiedIdentifier *this)

{
  QualifiedIdentifier *this_local;
  
  ~QualifiedIdentifier(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

QualifiedIdentifier (const Context& c)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
        }